

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(unsigned_long_long lhs,
         SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  unsigned_long_long local_8;
  
  local_8 = lhs;
  SVar1 = SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::
          operator%((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>
                     *)&local_8,rhs.m_int);
  if (SVar1.m_int < 0x80) {
    return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
           (char)SVar1.m_int;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}